

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef BinaryenAtomicFence(BinaryenModuleRef module)

{
  AtomicFence *pAVar1;
  Builder local_18;
  BinaryenModuleRef local_10;
  BinaryenModuleRef module_local;
  
  local_10 = module;
  wasm::Builder::Builder(&local_18,module);
  pAVar1 = wasm::Builder::makeAtomicFence(&local_18);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicFence(BinaryenModuleRef module) {
  return static_cast<Expression*>(Builder(*(Module*)module).makeAtomicFence());
}